

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_29c567::CliqueRunner::~CliqueRunner(CliqueRunner *this)

{
  _List_node_base *p_Var1;
  pointer piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _List_node_base *p_Var3;
  
  if (this->space != (int *)0x0) {
    operator_delete__(this->space);
  }
  p_Var3 = (this->watches).gathered_need_to_watch.
           super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&(this->watches).gathered_need_to_watch) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  p_Var3 = (this->watches).need_to_watch.
           super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&(this->watches).need_to_watch) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var1;
  }
  std::
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
  ::~vector(&(this->watches).table.data);
  std::__cxx11::_List_base<gss::innards::Nogood<int>,_std::allocator<gss::innards::Nogood<int>_>_>::
  _M_clear((_List_base<gss::innards::Nogood<int>,_std::allocator<gss::innards::Nogood<int>_>_> *)
           &this->watches);
  piVar2 = (this->invorder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->invorder).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  piVar2 = (this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->order).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (&this->connected_table);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::~vector
            (&this->adj);
  this_00 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  piVar2 = (this->incumbent).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(piVar2,(long)(this->incumbent).c.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  return;
}

Assistant:

~CliqueRunner()
        {
            delete[] space;
        }